

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  string_view *this_00;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  basic_string_view<char,_std::char_traits<char>_> v;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type pos;
  const_reference pcVar4;
  State SVar5;
  size_type sVar6;
  Kind KVar7;
  char *pcVar8;
  ulong pos_00;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view close;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar2 = this->m_pos;
  this->m_tok_start = uVar2;
  this_00 = &this->m_in;
  pos_00 = uVar2;
LAB_0019b359:
  if ((this->m_in).size_ <= uVar2) {
LAB_0019b5b3:
    KVar7 = Eof;
    goto LAB_0019b5c0;
  }
  switch(this->m_state) {
  case ExpressionStart:
    this->m_state = ExpressionBody;
    this->m_pos = pos_00 + (this->m_config->expression_open)._M_string_length;
    KVar7 = ExpressionOpen;
    goto LAB_0019b5c0;
  case ExpressionBody:
    pcVar8 = (this->m_config->expression_close)._M_dataplus._M_p;
    sVar6 = (this->m_config->expression_close)._M_string_length;
    KVar7 = ExpressionClose;
    break;
  case LineStart:
    this->m_state = LineBody;
    this->m_pos = pos_00 + (this->m_config->line_statement)._M_string_length;
    KVar7 = LineStatementOpen;
    goto LAB_0019b5c0;
  case LineBody:
    pcVar8 = "\n";
    sVar6 = 1;
    KVar7 = LineStatementClose;
    break;
  case StatementStart:
    this->m_state = StatementBody;
    this->m_pos = pos_00 + (this->m_config->statement_open)._M_string_length;
    KVar7 = StatementOpen;
    goto LAB_0019b5c0;
  case StatementBody:
    pcVar8 = (this->m_config->statement_close)._M_dataplus._M_p;
    sVar6 = (this->m_config->statement_close)._M_string_length;
    KVar7 = StatementClose;
    break;
  case CommentStart:
    this->m_state = CommentBody;
    this->m_pos = pos_00 + (this->m_config->comment_open)._M_string_length;
    KVar7 = CommentOpen;
    goto LAB_0019b5c0;
  case CommentBody:
    local_40 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,pos_00,0xffffffffffffffff);
    v.data_ = (this->m_config->comment_close)._M_dataplus._M_p;
    v.size_ = (this->m_config->comment_close)._M_string_length;
    sVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find(&local_40,v,0);
    if (sVar3 == 0xffffffffffffffff) {
      this->m_pos = (this->m_in).size_;
      goto LAB_0019b5b3;
    }
    this->m_state = Text;
    this->m_pos = this->m_pos + sVar3 + (this->m_config->comment_close)._M_string_length;
    KVar7 = CommentClose;
    goto LAB_0019b5c0;
  default:
    local_40 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,pos_00,0xffffffffffffffff);
    bVar9.data_ = (this->m_config->open_chars)._M_dataplus._M_p;
    bVar9.size_ = (this->m_config->open_chars)._M_string_length;
    sVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_40,bVar9,0);
    if (sVar3 == 0xffffffffffffffff) {
      this->m_pos = (this->m_in).size_;
      goto LAB_0019b59d;
    }
    pos = sVar3 + this->m_pos;
    this->m_pos = pos;
    bVar9 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                      (this_00,pos,0xffffffffffffffff);
    prefix.data_ = (this->m_config->expression_open)._M_dataplus._M_p;
    prefix.size_ = (this->m_config->expression_open)._M_string_length;
    bVar1 = string_view::starts_with(bVar9,prefix);
    SVar5 = ExpressionStart;
    if (!bVar1) {
      prefix_00.data_ = (this->m_config->statement_open)._M_dataplus._M_p;
      prefix_00.size_ = (this->m_config->statement_open)._M_string_length;
      bVar1 = string_view::starts_with(bVar9,prefix_00);
      SVar5 = StatementStart;
      if (bVar1) goto LAB_0019b45e;
      prefix_01.data_ = (this->m_config->comment_open)._M_dataplus._M_p;
      prefix_01.size_ = (this->m_config->comment_open)._M_string_length;
      bVar1 = string_view::starts_with(bVar9,prefix_01);
      SVar5 = CommentStart;
      if (!bVar1) {
        if ((this->m_pos == 0) ||
           (pcVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data_at
                               (this_00,this->m_pos - 1), *pcVar4 == '\n')) {
          prefix_02.data_ = (this->m_config->line_statement)._M_dataplus._M_p;
          prefix_02.size_ = (this->m_config->line_statement)._M_string_length;
          bVar1 = string_view::starts_with(bVar9,prefix_02);
          SVar5 = LineStart;
          if (bVar1) goto LAB_0019b45e;
        }
        uVar2 = this->m_tok_start;
        pos_00 = this->m_pos + 1;
        this->m_pos = pos_00;
        goto LAB_0019b359;
      }
    }
LAB_0019b45e:
    this->m_state = SVar5;
    uVar2 = this->m_pos;
    pos_00 = uVar2;
    if (uVar2 != this->m_tok_start) {
LAB_0019b59d:
      KVar7 = Text;
LAB_0019b5c0:
      make_token(__return_storage_ptr__,this,KVar7);
      return __return_storage_ptr__;
    }
    goto LAB_0019b359;
  }
  close.size_ = sVar6;
  close.data_ = pcVar8;
  scan_body(__return_storage_ptr__,this,close,KVar7);
  return __return_storage_ptr__;
}

Assistant:

Token scan() {
		m_tok_start = m_pos;

	again:
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);

		switch (m_state) {
			default:
			case State::Text: {
				// fast-scan to first open character
				size_t open_start = m_in.substr(m_pos).find_first_of(m_config.open_chars);
				if (open_start == nonstd::string_view::npos) {
					// didn't find open, return remaining text as text token
					m_pos = m_in.size();
					return make_token(Token::Kind::Text);
				}
				m_pos += open_start;

				// try to match one of the opening sequences, and get the close
				nonstd::string_view open_str = m_in.substr(m_pos);
				if (inja::string_view::starts_with(open_str, m_config.expression_open)) {
					m_state = State::ExpressionStart;
				} else if (inja::string_view::starts_with(open_str, m_config.statement_open)) {
					m_state = State::StatementStart;
				} else if (inja::string_view::starts_with(open_str, m_config.comment_open)) {
					m_state = State::CommentStart;
				} else if ((m_pos == 0 || m_in[m_pos - 1] == '\n') &&
						   inja::string_view::starts_with(open_str, m_config.line_statement)) {
					m_state = State::LineStart;
				} else {
					m_pos += 1;  // wasn't actually an opening sequence
					goto again;
				}
				if (m_pos == m_tok_start) goto again;  // don't generate empty token
				return make_token(Token::Kind::Text);
			}
			case State::ExpressionStart: {
				m_state = State::ExpressionBody;
				m_pos += m_config.expression_open.size();
				return make_token(Token::Kind::ExpressionOpen);
			}
			case State::LineStart: {
				m_state = State::LineBody;
				m_pos += m_config.line_statement.size();
				return make_token(Token::Kind::LineStatementOpen);
			}
			case State::StatementStart: {
				m_state = State::StatementBody;
				m_pos += m_config.statement_open.size();
				return make_token(Token::Kind::StatementOpen);
			}
			case State::CommentStart: {
				m_state = State::CommentBody;
				m_pos += m_config.comment_open.size();
				return make_token(Token::Kind::CommentOpen);
			}
			case State::ExpressionBody:
				return scan_body(m_config.expression_close, Token::Kind::ExpressionClose);
			case State::LineBody:
				return scan_body("\n", Token::Kind::LineStatementClose);
			case State::StatementBody:
				return scan_body(m_config.statement_close, Token::Kind::StatementClose);
			case State::CommentBody: {
				// fast-scan to comment close
				size_t end = m_in.substr(m_pos).find(m_config.comment_close);
				if (end == nonstd::string_view::npos) {
					m_pos = m_in.size();
					return make_token(Token::Kind::Eof);
				}
				// return the entire comment in the close token
				m_state = State::Text;
				m_pos += end + m_config.comment_close.size();
				return make_token(Token::Kind::CommentClose);
			}
		}
	}